

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitcell.hpp
# Opt level: O1

unitcell * lattice::unitcell::simple(unitcell *__return_storage_ptr__,size_t dim)

{
  ActualDstType actualDst;
  size_t sVar1;
  Index othersize;
  offset_t os;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_38;
  
  __return_storage_ptr__->dim_ = dim;
  (__return_storage_ptr__->sites_).
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->sites_).
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->sites_).
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->bonds_).
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->bonds_).
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->bonds_).
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.m_storage.m_data = (double *)0x0;
  local_38.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_38,dim,1);
  if (local_38.m_storage.m_rows != dim) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_38,dim,1);
  }
  if (0 < local_38.m_storage.m_rows) {
    memset(local_38.m_storage.m_data,0,local_38.m_storage.m_rows << 3);
  }
  add_site(__return_storage_ptr__,(coordinate_t *)&local_38,0);
  free(local_38.m_storage.m_data);
  if (dim != 0) {
    sVar1 = 0;
    do {
      local_38.m_storage.m_data = (double *)0x0;
      local_38.m_storage.m_rows = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *)&local_38,dim,1);
      if (local_38.m_storage.m_rows != dim) {
        Eigen::PlainObjectBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *)&local_38,dim,1);
      }
      if (0 < local_38.m_storage.m_rows) {
        memset(local_38.m_storage.m_data,0,local_38.m_storage.m_rows << 3);
      }
      local_38.m_storage.m_data[sVar1] = 4.94065645841247e-324;
      add_bond(__return_storage_ptr__,0,0,(offset_t *)&local_38,0);
      free(local_38.m_storage.m_data);
      sVar1 = sVar1 + 1;
    } while (dim != sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

static unitcell simple(std::size_t dim) {
    unitcell cell(dim);
    cell.add_site(coordinate_t::Zero(dim), 0);
    for (std::size_t m = 0; m < dim; ++m) {
      offset_t os = offset_t::Zero(dim);
      os(m) = 1;
      cell.add_bond(0, 0, os, 0);
    }
    return cell;
  }